

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_queue_tail(void)

{
  cio_write_buffer *pcVar1;
  uint data1;
  char data2 [13];
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh;
  
  wbh.data.head.q_len = 0;
  wbh.data.element.length = 0;
  wbh.next = &wbh;
  wbh.prev = &wbh;
  UnityAssertEqualNumber
            (0,0,
             "Number of elements in write buffer not \'0\' after initialization of write buffer head!"
             ,0x4c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,wbh.data.element.length,"Write buffer total length not correct!",0x4d,
             UNITY_DISPLAY_STYLE_INT);
  wb1.data.head.q_len = (size_t)&data1;
  data1 = 0x12;
  wb1.data.element.length = 4;
  cio_write_buffer_queue_tail(&wbh,&wb1);
  UnityAssertEqualNumber
            (1,wbh.data.head.q_len,
             "Number of elements in write buffer not \'1\' after inserting first element!",0x54,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,wbh.data.element.length,"Write buffer total length not correct!",0x55,
             UNITY_DISPLAY_STYLE_INT);
  wb2.data.head.q_len = (size_t)data2;
  builtin_strncpy(data2 + 8,"rld!",5);
  builtin_strncpy(data2,"Hello Wo",8);
  wb2.data.element.length = 0xd;
  cio_write_buffer_queue_tail(&wbh,&wb2);
  UnityAssertEqualNumber
            (2,wbh.data.head.q_len,
             "Number of elements in write buffer not \'2\' after inserting second element!",0x5c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,wbh.data.element.length,"Write buffer total length not correct!",0x5d,
             UNITY_DISPLAY_STYLE_INT);
  pcVar1 = cio_write_buffer_queue_dequeue(&wbh);
  UnityAssertEqualNumber
            ((UNITY_INT)&wb1,(UNITY_INT)pcVar1,
             "First dequeued write buffer is not the write buffer inserted first!",0x60,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,wbh.data.head.q_len,
             "Number of elements in write buffer not \'1\' after dequeueing first element!",0x62,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0xd,wbh.data.element.length,"Write buffer total length not correct!",99,
             UNITY_DISPLAY_STYLE_INT);
  pcVar1 = cio_write_buffer_queue_dequeue(&wbh);
  UnityAssertEqualNumber
            ((UNITY_INT)&wb2,(UNITY_INT)pcVar1,
             "First dequeued write buffer is not the write buffer inserted secondly!",0x66,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,wbh.data.head.q_len,
             "Number of elements in write buffer not \'0\' after dequeueing second element!",0x68,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,wbh.data.element.length,"Write buffer total length not correct!",0x69,
             UNITY_DISPLAY_STYLE_INT);
  pcVar1 = cio_write_buffer_queue_dequeue(&wbh);
  UnityAssertEqualNumber
            (0,(UNITY_INT)pcVar1,
             "Return value of cio_write_buffer_queue_dequeue not NULL when called on an empty write buffer!"
             ,0x6c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,wbh.data.head.q_len,
             "Number of elements in write buffer not \'0\' after dequeueing from an empty write buffer!"
             ,0x6e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_queue_tail(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after initialization of write buffer head!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1;
	cio_write_buffer_element_init(&wb1, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after inserting first element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	struct cio_write_buffer *dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1, dequeued_wb, "First dequeued write buffer is not the write buffer inserted first!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after dequeueing first element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2, dequeued_wb, "First dequeued write buffer is not the write buffer inserted secondly!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after dequeueing second element!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(NULL, dequeued_wb, "Return value of cio_write_buffer_queue_dequeue not NULL when called on an empty write buffer!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after dequeueing from an empty write buffer!");
}